

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglResizeTests.cpp
# Opt level: O3

IterateResult __thiscall deqp::egl::ChangeSurfaceSizeCase::iterate(ChangeSurfaceSizeCase *this)

{
  ResultCollector *status;
  EGLSurface draw;
  deUint32 err;
  Library *egl;
  IVec2 oldEglSize;
  ScopedCurrentContext currentCtx;
  int local_58 [2];
  ScopedCurrentContext local_50;
  IVec2 local_40;
  IVec2 local_38;
  IVec2 local_30;
  IVec2 local_28;
  egl local_20 [8];
  
  egl = EglTestContext::getLibrary((this->super_ResizeTest).super_TestCase.m_eglTestCtx);
  draw = ((this->super_ResizeTest).m_surface.
          super_UniqueBase<eglu::UniqueSurface,_de::DefaultDeleter<eglu::UniqueSurface>_>.m_data.ptr
         )->m_surface;
  eglu::ScopedCurrentContext::ScopedCurrentContext
            (&local_50,egl,(this->super_ResizeTest).m_display,draw,draw,
             ((this->super_ResizeTest).m_context.
              super_UniqueBase<eglu::UniqueContext,_de::DefaultDeleter<eglu::UniqueContext>_>.m_data
             .ptr)->m_context);
  local_28.m_data = *&(this->super_ResizeTest).m_oldSize.m_data;
  status = &(this->super_ResizeTest).m_status;
  checkSurfaceSize((egl *)local_58,egl,(this->super_ResizeTest).m_display,
                   ((this->super_ResizeTest).m_surface.
                    super_UniqueBase<eglu::UniqueSurface,_de::DefaultDeleter<eglu::UniqueSurface>_>.
                    m_data.ptr)->m_surface,
                   (this->super_ResizeTest).m_nativeWindow.
                   super_UniqueBase<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_>.
                   m_data.ptr,&local_28,status);
  local_30.m_data[0] = local_58[0];
  local_30.m_data[1] = local_58[1];
  initSurface(&(this->super_ResizeTest).m_gl,&local_30);
  local_38.m_data = *&(this->super_ResizeTest).m_newSize.m_data;
  ResizeTest::resize(&this->super_ResizeTest,&local_38);
  (*egl->_vptr_Library[0x31])
            (egl,(this->super_ResizeTest).m_display,
             ((this->super_ResizeTest).m_surface.
              super_UniqueBase<eglu::UniqueSurface,_de::DefaultDeleter<eglu::UniqueSurface>_>.m_data
             .ptr)->m_surface);
  err = (*egl->_vptr_Library[0x1f])(egl);
  eglu::checkError(err,"eglSwapBuffers()",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglResizeTests.cpp"
                   ,0x16a);
  local_40.m_data = *&(this->super_ResizeTest).m_newSize.m_data;
  checkSurfaceSize(local_20,egl,(this->super_ResizeTest).m_display,
                   ((this->super_ResizeTest).m_surface.
                    super_UniqueBase<eglu::UniqueSurface,_de::DefaultDeleter<eglu::UniqueSurface>_>.
                    m_data.ptr)->m_surface,
                   (this->super_ResizeTest).m_nativeWindow.
                   super_UniqueBase<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_>.
                   m_data.ptr,&local_40,status);
  tcu::ResultCollector::setTestContextResult
            (status,(this->super_ResizeTest).super_TestCase.super_TestCase.super_TestNode.m_testCtx)
  ;
  eglu::ScopedCurrentContext::~ScopedCurrentContext(&local_50);
  return STOP;
}

Assistant:

IterateResult ChangeSurfaceSizeCase::iterate (void)
{
	const Library&			egl			= m_eglTestCtx.getLibrary();
	ScopedCurrentContext	currentCtx	(egl, m_display, **m_surface, **m_surface, **m_context);
	IVec2					oldEglSize	= checkSurfaceSize(egl,
														   m_display,
														   **m_surface,
														   *m_nativeWindow,
														   m_oldSize,
														   m_status);

	initSurface(m_gl, oldEglSize);

	this->resize(m_newSize);

	egl.swapBuffers(m_display, **m_surface);
	EGLU_CHECK_MSG(egl, "eglSwapBuffers()");
	checkSurfaceSize(egl, m_display, **m_surface, *m_nativeWindow, m_newSize, m_status);

	m_status.setTestContextResult(m_testCtx);
	return STOP;
}